

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t a,int b,int c,ValidityMask *mask,idx_t idx)

{
  long lVar1;
  OutOfRangeException *this;
  InvalidInputException *this_00;
  undefined8 extraout_RDX;
  Bit *this_01;
  char *__dest;
  void *__src;
  ulong __n;
  string_t sVar2;
  string_t sVar3;
  anon_union_16_2_67f50693_for_value local_a0;
  undefined1 local_90 [16];
  undefined8 local_80;
  void *local_78;
  string local_70;
  string local_50;
  
  sVar2.value._8_8_ = a.value._8_8_;
  this_01 = a.value._0_8_;
  local_80 = this_01;
  local_78 = sVar2.value._8_8_;
  if (1 < (uint)c) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_a0._0_8_ = local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"The new bit must be 1 or 0","");
    duckdb::InvalidInputException::InvalidInputException(this_00,(string *)&local_a0.pointer);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (-1 < b) {
    sVar2.value._0_8_ = sVar2.value._8_8_;
    lVar1 = duckdb::Bit::BitLength(this_01,sVar2);
    if ((ulong)(uint)b <= lVar1 - 1U) {
      __n = (ulong)local_80 & 0xffffffff;
      local_a0 = (anon_union_16_2_67f50693_for_value)
                 duckdb::StringVector::EmptyString(fun.result,__n);
      __dest = local_a0.pointer.ptr;
      if (local_a0.pointer.length < 0xd) {
        __dest = local_a0.pointer.prefix;
      }
      __src = sVar2.value._8_8_;
      if (__n < 0xd) {
        __src = (void *)((long)&local_80 + 4);
      }
      memcpy(__dest,__src,__n);
      duckdb::Bit::SetBit((string_t *)&local_a0.pointer,(ulong)(uint)b,(ulong)(uint)c);
      return (anon_union_16_2_67f50693_for_value)
             (anon_union_16_2_67f50693_for_value)local_a0.pointer;
    }
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"bit index %s out of valid range (0..%s)","");
  NumericHelper::ToString<int>(&local_50,b);
  sVar3.value.pointer.ptr = (char *)extraout_RDX;
  sVar3.value._0_8_ = sVar2.value._8_8_;
  lVar1 = duckdb::Bit::BitLength(this_01,sVar3);
  NumericHelper::ToString<unsigned_long>(&local_70,lVar1 - 1);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,(string *)&local_a0.pointer,&local_50,&local_70);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}